

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O0

int x86MOVSD(uchar *stream,x86Size size,x86Reg index,int multiplier,x86Reg base,int shift,
            x86XmmReg src)

{
  uint uVar1;
  uchar *puVar2;
  uchar *start;
  int shift_local;
  x86Reg base_local;
  int multiplier_local;
  x86Reg index_local;
  x86Size size_local;
  uchar *stream_local;
  
  if (size == sQWORD) {
    *stream = 0xf2;
    uVar1 = encodeRex(stream + 1,false,src,index,base);
    puVar2 = stream + 1 + uVar1;
    *puVar2 = '\x0f';
    puVar2[1] = '\x11';
    uVar1 = encodeAddress(puVar2 + 2,index,multiplier,base,shift,(int)(char)src);
    return ((int)(puVar2 + 2) + uVar1) - (int)stream;
  }
  __assert_fail("size == sQWORD",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Translator_X86.cpp"
                ,0x12e,"int x86MOVSD(unsigned char *, x86Size, x86Reg, int, x86Reg, int, x86XmmReg)"
               );
}

Assistant:

int x86MOVSD(unsigned char *stream, x86Size size, x86Reg index, int multiplier, x86Reg base, int shift, x86XmmReg src)
{
	unsigned char *start = stream;

	assert(size == sQWORD);
	(void)size;

	*stream++ = 0xf2;
	stream += encodeRex(stream, false, src, index, base);
	*stream++ = 0x0f;
	*stream++ = 0x11;
	stream += encodeAddress(stream, index, multiplier, base, shift, (char)src);

	return int(stream - start);
}